

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cFramebufferNoAttachmentsTests.cpp
# Opt level: O1

void __thiscall
glcts::FramebufferNoAttachmentsApiCase::begin_fbo_no_attachments
          (FramebufferNoAttachmentsApiCase *this,GLenum target)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*((this->super_FramebufferNoAttachmentsBaseCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x6d0))(1,&this->m_fbo);
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x78))(target,this->m_fbo);
  FramebufferNoAttachmentsBaseCase::expect_fbo_status
            (&this->super_FramebufferNoAttachmentsBaseCase,target,0x8cd7,
             "error setting up framebuffer with multisample attachment");
  return;
}

Assistant:

void FramebufferNoAttachmentsApiCase::begin_fbo_no_attachments(GLenum target)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.genFramebuffers(1, &m_fbo);
	gl.bindFramebuffer(target, m_fbo);

	// A freshly created framebuffer with no attachment is expected to be incomplete
	// until default width and height is set.
	expect_fbo_status(target, GL_FRAMEBUFFER_INCOMPLETE_MISSING_ATTACHMENT,
					  "error setting up framebuffer with multisample attachment");
}